

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

DWARFDie __thiscall
llvm::DWARFDie::getAttributeValueAsReferencedDie(DWARFDie *this,DWARFFormValue *V)

{
  bool bVar1;
  DWARFUnit *pDVar2;
  DWARFDebugInfoEntry *extraout_RDX;
  DWARFDebugInfoEntry *extraout_RDX_00;
  DWARFDie DVar3;
  undefined1 local_38 [8];
  Optional<llvm::DWARFFormValue::UnitOffset> SpecRef;
  
  pDVar2 = (DWARFUnit *)
           DWARFFormValue::getAsRelativeReference
                     ((Optional<llvm::DWARFFormValue::UnitOffset> *)local_38,V);
  DVar3.Die = extraout_RDX;
  DVar3.U = pDVar2;
  bVar1 = true;
  if (SpecRef.Storage.field_0.value.Offset._0_1_ == '\x01') {
    if (local_38 == (undefined1  [8])0x0) {
      local_38 = (undefined1  [8])
                 DWARFUnitVector::getUnitForOffset
                           (this->U->UnitVector,(uint64_t)SpecRef.Storage.field_0.value.Unit);
      DVar3.Die = extraout_RDX_00;
      DVar3.U = (DWARFUnit *)local_38;
      if (local_38 == (undefined1  [8])0x0) goto LAB_00d8478e;
      if (SpecRef.Storage.field_0.value.Offset._0_1_ == '\0') {
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xad,
                      "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset>::getValue() & [T = llvm::DWARFFormValue::UnitOffset]"
                     );
      }
    }
    else {
      SpecRef.Storage.field_0.value.Unit =
           (DWARFUnit *)
           ((long)&(SpecRef.Storage.field_0.value.Unit)->_vptr_DWARFUnit +
           ((DWARFUnitHeader *)((long)local_38 + 0x18))->Offset);
    }
    DVar3 = DWARFUnit::getDIEForOffset
                      ((DWARFUnit *)local_38,(uint64_t)SpecRef.Storage.field_0.value.Unit);
    bVar1 = false;
  }
LAB_00d8478e:
  if (bVar1) {
    DVar3 = (DWARFDie)ZEXT816(0);
  }
  return DVar3;
}

Assistant:

DWARFDie
DWARFDie::getAttributeValueAsReferencedDie(const DWARFFormValue &V) const {
  if (auto SpecRef = V.getAsRelativeReference()) {
    if (SpecRef->Unit)
      return SpecRef->Unit->getDIEForOffset(SpecRef->Unit->getOffset() + SpecRef->Offset);
    if (auto SpecUnit = U->getUnitVector().getUnitForOffset(SpecRef->Offset))
      return SpecUnit->getDIEForOffset(SpecRef->Offset);
  }
  return DWARFDie();
}